

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

void for_all_record_sizes(char *filename_fmt,_func_void_int_char_ptr_char_ptr *tests)

{
  uint uVar1;
  char local_236 [8];
  char description [14];
  char filename [500];
  int local_28;
  int size;
  int i;
  int sizes [3];
  _func_void_int_char_ptr_char_ptr *tests_local;
  char *filename_fmt_local;
  
  sizes._4_8_ = tests;
  _size = 0x1c00000018;
  sizes[0] = 0x20;
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    uVar1 = (&size)[local_28];
    snprintf(description + 6,500,filename_fmt,(ulong)uVar1);
    snprintf(local_236,0xe,"%i bit record",(ulong)uVar1);
    (*(code *)sizes._4_8_)(uVar1,description + 6,local_236);
  }
  return;
}

Assistant:

void for_all_record_sizes(const char *filename_fmt,
                          void (*tests)(int record_size,
                                        const char *filename,
                                        const char *description)) {
    int sizes[] = {24, 28, 32};
    for (int i = 0; i < 3; i++) {
        int size = sizes[i];

        char filename[500];
#if defined(__clang__)
// This warning seems ok to ignore here in the tests.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
        snprintf(filename, 500, filename_fmt, size);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif

        char description[14];
        snprintf(description, 14, "%i bit record", size);

        tests(size, filename, description);
    }
}